

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void google::protobuf::internal::ExtensionSet::RegisterMessageExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed,
               MessageLite *prototype,LazyEagerVerifyFnType verify_func,LazyAnnotation is_lazy)

{
  ExtensionInfo local_40;
  
  if ((type & 0xfe) == 10) {
    local_40.is_lazy = is_lazy;
    local_40.field_6.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
    local_40.field_6.enum_validity_check.arg = (void *)0x0;
    local_40.descriptor = (FieldDescriptor *)0x0;
    local_40.lazy_eager_verify_func = verify_func;
    local_40.message = extendee;
    local_40.number = number;
    local_40.type = type;
    local_40.is_repeated = is_repeated;
    local_40.is_packed = is_packed;
    local_40.field_6.message_info.tc_table = MessageLite::GetTcParseTable(prototype);
    local_40.field_6.message_info.prototype = prototype;
    anon_unknown_59::Register(&local_40);
    return;
  }
  RegisterMessageExtension((ExtensionSet *)&local_40);
}

Assistant:

void ExtensionSet::RegisterMessageExtension(const MessageLite* extendee,
                                            int number, FieldType type,
                                            bool is_repeated, bool is_packed,
                                            const MessageLite* prototype,
                                            LazyEagerVerifyFnType verify_func,
                                            LazyAnnotation is_lazy) {
  ABSL_CHECK(type == WireFormatLite::TYPE_MESSAGE ||
             type == WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed,
                     verify_func, is_lazy);
  info.message_info = {prototype,
#if defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
                       prototype->GetTcParseTable()
#else
                       nullptr
#endif
  }